

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_pubkey_combine
              (secp256k1_context *ctx,secp256k1_pubkey *pubnonce,secp256k1_pubkey **pubnonces,
              size_t n)

{
  int iVar1;
  undefined1 local_110 [8];
  secp256k1_ge Q;
  secp256k1_gej Qj;
  size_t i;
  size_t n_local;
  secp256k1_pubkey **pubnonces_local;
  secp256k1_pubkey *pubnonce_local;
  secp256k1_context *ctx_local;
  
  if (pubnonce == (secp256k1_pubkey *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"pubnonce != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    memset(pubnonce,0,0x40);
    if (n == 0) {
      secp256k1_callback_call(&ctx->illegal_callback,"n >= 1");
      ctx_local._4_4_ = 0;
    }
    else if (pubnonces == (secp256k1_pubkey **)0x0) {
      secp256k1_callback_call(&ctx->illegal_callback,"pubnonces != NULL");
      ctx_local._4_4_ = 0;
    }
    else {
      secp256k1_gej_set_infinity((secp256k1_gej *)&Q.infinity);
      Qj.infinity = 0;
      Qj._124_4_ = 0;
      for (; (ulong)Qj._120_8_ < n; Qj._120_8_ = Qj._120_8_ + 1) {
        secp256k1_pubkey_load(ctx,(secp256k1_ge *)local_110,pubnonces[Qj._120_8_]);
        secp256k1_gej_add_ge
                  ((secp256k1_gej *)&Q.infinity,(secp256k1_gej *)&Q.infinity,
                   (secp256k1_ge *)local_110);
      }
      iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)&Q.infinity);
      if (iVar1 == 0) {
        secp256k1_ge_set_gej((secp256k1_ge *)local_110,(secp256k1_gej *)&Q.infinity);
        secp256k1_pubkey_save(pubnonce,(secp256k1_ge *)local_110);
        ctx_local._4_4_ = 1;
      }
      else {
        ctx_local._4_4_ = 0;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ec_pubkey_combine(const secp256k1_context* ctx, secp256k1_pubkey *pubnonce, const secp256k1_pubkey * const *pubnonces, size_t n) {
    size_t i;
    secp256k1_gej Qj;
    secp256k1_ge Q;

    ARG_CHECK(pubnonce != NULL);
    memset(pubnonce, 0, sizeof(*pubnonce));
    ARG_CHECK(n >= 1);
    ARG_CHECK(pubnonces != NULL);

    secp256k1_gej_set_infinity(&Qj);

    for (i = 0; i < n; i++) {
        secp256k1_pubkey_load(ctx, &Q, pubnonces[i]);
        secp256k1_gej_add_ge(&Qj, &Qj, &Q);
    }
    if (secp256k1_gej_is_infinity(&Qj)) {
        return 0;
    }
    secp256k1_ge_set_gej(&Q, &Qj);
    secp256k1_pubkey_save(pubnonce, &Q);
    return 1;
}